

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc-twoparty-test.c++
# Opt level: O1

void __thiscall capnp::_::anon_unknown_0::TestCase100::run(TestCase100 *this)

{
  int *callCount_00;
  Builder builder;
  PromiseNode *pPVar1;
  long *plVar2;
  AsyncIoStream *pAVar3;
  AsyncIoProvider *pAVar4;
  CapTableBuilder *pCVar5;
  WirePointer *pWVar6;
  RequestHook *pRVar7;
  undefined8 uVar8;
  SegmentBuilder *pSVar9;
  undefined8 uVar10;
  Disposer *pDVar11;
  size_t sVar12;
  undefined4 uVar13;
  int iVar14;
  TransformPromiseNodeBase *this_00;
  size_t __n;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  Client CVar15;
  Reader RVar16;
  ReaderOptions receiveOptions;
  bool barFailed;
  int callCount;
  PromiseForResult<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_rpc_twoparty_test_c__:126:7),_capnp::Response<capnproto_test::capnp::test::TestInterface::BarResults>_>
  promise3;
  Client client;
  Response<capnproto_test::capnp::test::TestInterface::FooResults> response1;
  PipeThread serverThread;
  AsyncIoContext ioContext;
  RemotePromise<capnproto_test::capnp::test::TestInterface::BazResults> promise2;
  RemotePromise<capnproto_test::capnp::test::TestInterface::FooResults> promise1;
  RpcSystem<capnp::rpc::twoparty::VatId> rpcClient;
  int handleCount;
  Request<capnproto_test::capnp::test::TestInterface::BazParams,_capnproto_test::capnp::test::TestInterface::BazResults>
  request2;
  Request<capnproto_test::capnp::test::TestInterface::BarParams,_capnproto_test::capnp::test::TestInterface::BarResults>
  request3;
  Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
  request1;
  Response<capnproto_test::capnp::test::TestInterface::BazResults> response2;
  TwoPartyVatNetwork network;
  undefined1 local_595 [5];
  Own<kj::_::PromiseNode> local_590;
  undefined1 local_580 [16];
  long *plStack_570;
  Promise<capnp::Response<capnproto_test::capnp::test::TestInterface::FooResults>_> local_568;
  size_t local_550;
  short local_544;
  undefined4 local_540;
  undefined8 *local_538;
  long *local_530;
  PipeThread local_528;
  undefined8 *local_508;
  long *local_500;
  undefined8 *local_4f8;
  AsyncIoProvider *local_4f0;
  WaitScope *local_4e8;
  SegmentBuilder *local_4d8;
  CapTableBuilder *in_stack_fffffffffffffb30;
  undefined8 *in_stack_fffffffffffffb38;
  WirePointer *in_stack_fffffffffffffb40;
  long in_stack_fffffffffffffb48;
  Disposer *in_stack_fffffffffffffb50;
  RequestHook *local_4a8;
  Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
  local_4a0;
  RpcSystemBase local_468;
  int local_454;
  Request<capnproto_test::capnp::test::TestInterface::BazParams,_capnproto_test::capnp::test::TestInterface::BazResults>
  local_450;
  Request<capnproto_test::capnp::test::TestInterface::BarParams,_capnproto_test::capnp::test::TestInterface::BarResults>
  local_418;
  Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
  local_3e0;
  ArrayPtr<const_char> local_3a8 [3];
  undefined8 *local_378;
  long *local_370;
  StructBuilder local_368;
  SegmentBuilder *local_340;
  anon_union_344_1_a8c68091_for_NullableValue<kj::Exception>_2 aStack_338;
  char local_1e0;
  Maybe<capnp::MessageSize> local_1d8;
  Maybe<capnp::MessageSize> local_1c0;
  Maybe<capnp::MessageSize> local_1a8;
  TwoPartyVatNetwork local_190;
  
  kj::setupAsyncIo();
  callCount_00 = (int *)(local_595 + 1);
  local_595._1_4_ = 0;
  local_454 = 0;
  runServer(&local_528,local_4f0,callCount_00,&local_454);
  receiveOptions._8_8_ = 0x40;
  receiveOptions.traversalLimitInWords = 0x800000;
  iVar14 = 0x40;
  __n = 0x800000;
  TwoPartyVatNetwork::TwoPartyVatNetwork(&local_190,local_528.pipe.ptr,CLIENT,receiveOptions);
  makeRpcClient<capnp::rpc::twoparty::VatId,capnp::rpc::twoparty::ProvisionId,capnp::rpc::twoparty::RecipientId,capnp::rpc::twoparty::ThirdPartyCapId,capnp::rpc::twoparty::JoinResult>
            ((capnp *)&local_468,&local_190.super_TwoPartyVatNetworkBase);
  CVar15 = getPersistentCap((RpcSystem<capnp::rpc::twoparty::VatId> *)&local_568,(Side)&local_468,
                            TEST_INTERFACE);
  (*(local_568.super_PromiseBase.node.ptr)->_vptr_PromiseNode[4])
            ((NullableValue<kj::Exception> *)&local_340,local_568.super_PromiseBase.node.ptr,
             CVar15.hook.ptr);
  pPVar1 = local_568.super_PromiseBase.node.ptr;
  local_580._8_4_ = local_340._0_4_;
  local_580._12_4_ = local_340._4_4_;
  plStack_570 = (long *)aStack_338.value.ownFile.content.ptr;
  local_580._0_8_ = &Capability::Client::typeinfo;
  if (local_568.super_PromiseBase.node.ptr != (PromiseNode *)0x0) {
    local_568.super_PromiseBase.node.ptr = (PromiseNode *)0x0;
    (**(local_568.super_PromiseBase.node.disposer)->_vptr_Disposer)
              (local_568.super_PromiseBase.node.disposer,
               (_func_int *)((long)&pPVar1->_vptr_PromiseNode + (long)pPVar1->_vptr_PromiseNode[-2])
              );
  }
  local_1a8.ptr.isSet = false;
  capnproto_test::capnp::test::TestInterface::Client::fooRequest
            (&local_3e0,(Client *)local_580,&local_1a8);
  *(undefined4 *)local_3e0.super_Builder._builder.data = 0x7b;
  *(byte *)((long)local_3e0.super_Builder._builder.data + 4) =
       *(byte *)((long)local_3e0.super_Builder._builder.data + 4) | 1;
  Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
  ::send(&local_4a0,(int)&local_3e0,__buf,__n,iVar14);
  local_1c0.ptr.isSet = false;
  capnproto_test::capnp::test::TestInterface::Client::bazRequest
            (&local_450,(Client *)local_580,&local_1c0);
  local_340 = local_450.super_Builder._builder.segment;
  aStack_338.value.ownFile.content.ptr = (char *)local_450.super_Builder._builder.capTable;
  aStack_338.value.ownFile.content.size_ = (size_t)local_450.super_Builder._builder.pointers;
  PointerBuilder::initStruct(&local_368,(PointerBuilder *)&local_340,(StructSize)0x140006);
  builder._builder.capTable = (CapTableBuilder *)in_stack_fffffffffffffb38;
  builder._builder.segment = (SegmentBuilder *)in_stack_fffffffffffffb30;
  builder._builder.data = in_stack_fffffffffffffb40;
  builder._builder.pointers = (WirePointer *)in_stack_fffffffffffffb48;
  builder._builder._32_8_ = in_stack_fffffffffffffb50;
  initTestMessage(builder);
  Request<capnproto_test::capnp::test::TestInterface::BazParams,_capnproto_test::capnp::test::TestInterface::BazResults>
  ::send((Request<capnproto_test::capnp::test::TestInterface::BazParams,_capnproto_test::capnp::test::TestInterface::BazResults>
          *)&local_4d8,(int)&local_450,__buf_00,__n,iVar14);
  local_595[0] = '\0';
  local_1d8.ptr.isSet = false;
  capnproto_test::capnp::test::TestInterface::Client::barRequest
            (&local_418,(Client *)local_580,&local_1d8);
  Request<capnproto_test::capnp::test::TestInterface::BarParams,_capnproto_test::capnp::test::TestInterface::BarResults>
  ::send((Request<capnproto_test::capnp::test::TestInterface::BarParams,_capnproto_test::capnp::test::TestInterface::BarResults>
          *)&local_340,(int)&local_418,__buf_01,__n,iVar14);
  this_00 = (TransformPromiseNodeBase *)operator_new(0x30);
  kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
            (this_00,(Own<kj::_::PromiseNode> *)&local_340,
             kj::_::
             TransformPromiseNode<kj::_::Void,_capnp::Response<capnproto_test::capnp::test::TestInterface::BarResults>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc-twoparty-test.c++:126:7),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc-twoparty-test.c++:128:10)>
             ::anon_class_1_0_00000001_for_func::operator());
  uVar8 = aStack_338._32_8_;
  uVar10 = aStack_338.value.file;
  (this_00->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_00634868;
  this_00[1].dependency.disposer = (Disposer *)local_595;
  local_590.disposer =
       (Disposer *)
       &kj::_::
        HeapDisposer<kj::_::TransformPromiseNode<kj::_::Void,capnp::Response<capnproto_test::capnp::test::TestInterface::BarResults>,capnp::_::(anonymous_namespace)::TestCase100::run()::$_0,capnp::_::(anonymous_namespace)::TestCase100::run()::$_1>>
        ::instance;
  local_590.ptr = (PromiseNode *)this_00;
  if (aStack_338.value.file != (char *)0x0) {
    aStack_338.value.file = (char *)0x0;
    aStack_338._32_8_ = 0;
    (*(code *)**(undefined8 **)aStack_338.value.description.content.ptr)
              (aStack_338.value.description.content.ptr,uVar10,8,uVar8,uVar8,0);
  }
  uVar10 = aStack_338.value.ownFile.content.disposer;
  if (aStack_338.value.ownFile.content.disposer != (ArrayDisposer *)0x0) {
    aStack_338.value.ownFile.content.disposer = (ArrayDisposer *)0x0;
    (*(code *)**(undefined8 **)aStack_338.value.ownFile.content.size_)
              (aStack_338.value.ownFile.content.size_,
               (_func_int *)
               ((long)&((ArrayDisposer *)uVar10)->_vptr_ArrayDisposer +
               (long)((ArrayDisposer *)uVar10)->_vptr_ArrayDisposer[-2]));
  }
  uVar10 = aStack_338.value.ownFile.content.ptr;
  if ((long *)aStack_338.value.ownFile.content.ptr != (long *)0x0) {
    aStack_338.value.ownFile.content.ptr = (char *)0x0;
    (*(code *)((local_340->super_SegmentReader).arena)->_vptr_Arena)
              (local_340,(char *)(uVar10 + *(long *)(*(long *)uVar10 + -0x10)));
  }
  if ((local_595._1_4_ != 0) && (kj::_::Debug::minSeverity < 3)) {
    local_340 = (SegmentBuilder *)((ulong)local_340 & 0xffffffff00000000);
    kj::_::Debug::log<char_const(&)[36],int,int&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc-twoparty-test.c++"
               ,0x84,ERROR,"\"failed: expected \" \"(0) == (callCount)\", 0, callCount",
               (char (*) [36])"failed: expected (0) == (callCount)",(int *)&local_340,callCount_00);
  }
  kj::Promise<capnp::Response<capnproto_test::capnp::test::TestInterface::FooResults>_>::wait
            (&local_568,&local_4a0);
  aStack_338.value.ownFile.content.ptr = (char *)local_568.super_PromiseBase.node.ptr;
  aStack_338.value.ownFile.content.size_ = local_550;
  local_340 = (SegmentBuilder *)local_568.super_PromiseBase.node.disposer;
  uVar13 = local_540;
  if (local_544 == 0) {
    aStack_338.value.ownFile.content.ptr = (char *)(PromiseNode *)0x0;
    aStack_338.value.ownFile.content.size_ = 0;
    local_340 = (SegmentBuilder *)(Disposer *)0x0;
    uVar13 = 0x7fffffff;
  }
  aStack_338._16_4_ = uVar13;
  RVar16 = PointerReader::getBlob<capnp::Text>((PointerReader *)&local_340,(void *)0x0,0);
  pDVar11 = local_568.super_PromiseBase.node.disposer;
  sVar12 = local_550;
  pSVar9 = local_340;
  uVar10 = aStack_338.value.ownFile.content.size_;
  if (((RVar16.super_StringPtr.content.size_ != 4) ||
      (iVar14 = bcmp(RVar16.super_StringPtr.content.ptr,"foo",3), pSVar9 = local_340,
      uVar10 = aStack_338.value.ownFile.content.size_,
      pDVar11 = local_568.super_PromiseBase.node.disposer, sVar12 = local_550, iVar14 != 0)) &&
     (aStack_338.value.ownFile.content.size_ = sVar12, local_340 = (SegmentBuilder *)pDVar11,
     kj::_::Debug::minSeverity < 3)) {
    aStack_338.value.ownFile.content.ptr = (char *)local_568.super_PromiseBase.node.ptr;
    if (local_544 == 0) {
      local_540 = 0x7fffffff;
      aStack_338.value.ownFile.content.size_ = 0;
      local_340 = (SegmentBuilder *)0x0;
      aStack_338.value.ownFile.content.ptr = (char *)(PromiseNode *)0x0;
    }
    aStack_338._20_4_ = (undefined4)((ulong)aStack_338.value.ownFile.content.disposer >> 0x20);
    aStack_338._16_4_ = local_540;
    local_3a8[0] = (ArrayPtr<const_char>)
                   PointerReader::getBlob<capnp::Text>((PointerReader *)&local_340,(void *)0x0,0);
    kj::_::Debug::log<char_const(&)[47],char_const(&)[4],capnp::Text::Reader>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc-twoparty-test.c++"
               ,0x88,ERROR,
               "\"failed: expected \" \"(\\\"foo\\\") == (response1.getX())\", \"foo\", response1.getX()"
               ,(char (*) [47])"failed: expected (\"foo\") == (response1.getX())",
               (char (*) [4])0x4fa6a4,(Reader *)local_3a8);
    pSVar9 = local_340;
    uVar10 = aStack_338.value.ownFile.content.size_;
  }
  aStack_338.value.ownFile.content.size_ = uVar10;
  local_340 = pSVar9;
  kj::Promise<capnp::Response<capnproto_test::capnp::test::TestInterface::BazResults>_>::wait
            ((Promise<capnp::Response<capnproto_test::capnp::test::TestInterface::BazResults>_> *)
             local_3a8,&local_4d8);
  local_340 = (SegmentBuilder *)((ulong)local_340 & 0xffffffffffffff00);
  local_1e0 = '\0';
  kj::_::waitImpl(&local_590,(ExceptionOrValue *)&local_340,local_4e8);
  if (local_1e0 == '\x01') {
    if (local_340._0_1_ != false) {
      kj::throwRecoverableException((Exception *)&aStack_338,0);
    }
  }
  else {
    if (local_340._0_1_ == false) {
      kj::_::unreachable();
    }
    kj::throwRecoverableException((Exception *)&aStack_338,0);
  }
  if (local_340._0_1_ == true) {
    kj::Exception::~Exception((Exception *)&aStack_338);
  }
  if ((local_595._1_4_ != 2) && (kj::_::Debug::minSeverity < 3)) {
    local_340 = (SegmentBuilder *)CONCAT44(local_340._4_4_,2);
    kj::_::Debug::log<char_const(&)[36],int,int&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc-twoparty-test.c++"
               ,0x8e,ERROR,"\"failed: expected \" \"(2) == (callCount)\", 2, callCount",
               (char (*) [36])"failed: expected (2) == (callCount)",(int *)&local_340,callCount_00);
  }
  if ((local_595[0] == '\0') && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[27]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc-twoparty-test.c++"
               ,0x8f,ERROR,"\"failed: expected \" \"barFailed\"",
               (char (*) [27])"failed: expected barFailed");
  }
  plVar2 = local_370;
  if (local_370 != (long *)0x0) {
    local_370 = (long *)0x0;
    (**(code **)*local_378)(local_378,(long)plVar2 + *(long *)(*plVar2 + -0x10));
  }
  plVar2 = local_530;
  if (local_530 != (long *)0x0) {
    local_530 = (long *)0x0;
    (**(code **)*local_538)(local_538,(long)plVar2 + *(long *)(*plVar2 + -0x10));
  }
  pPVar1 = local_590.ptr;
  if ((TransformPromiseNodeBase *)local_590.ptr != (TransformPromiseNodeBase *)0x0) {
    local_590.ptr = (PromiseNode *)0x0;
    (**(local_590.disposer)->_vptr_Disposer)
              (local_590.disposer,
               (_func_int *)
               ((long)&((PromiseNode *)&pPVar1->_vptr_PromiseNode)->_vptr_PromiseNode +
               (long)((PromiseNode *)&pPVar1->_vptr_PromiseNode)->_vptr_PromiseNode[-2]));
  }
  pRVar7 = local_418.hook.ptr;
  if (local_418.hook.ptr != (RequestHook *)0x0) {
    local_418.hook.ptr = (RequestHook *)0x0;
    (**(local_418.hook.disposer)->_vptr_Disposer)
              (local_418.hook.disposer,
               (_func_int *)((long)&pRVar7->_vptr_RequestHook + (long)pRVar7->_vptr_RequestHook[-2])
              );
  }
  if (in_stack_fffffffffffffb48 != 0) {
    (**local_4a8->_vptr_RequestHook)
              (local_4a8,in_stack_fffffffffffffb48,8,in_stack_fffffffffffffb50,
               in_stack_fffffffffffffb50,0);
  }
  if (in_stack_fffffffffffffb40 != (WirePointer *)0x0) {
    (**(code **)*in_stack_fffffffffffffb38)
              (in_stack_fffffffffffffb38,
               (long)&(in_stack_fffffffffffffb40->offsetAndKind).value +
               *(long *)((long)*in_stack_fffffffffffffb40 + -0x10));
  }
  if (in_stack_fffffffffffffb30 != (CapTableBuilder *)0x0) {
    (*(code *)((local_4d8->super_SegmentReader).arena)->_vptr_Arena)
              (local_4d8,
               (_func_int *)
               ((long)&(in_stack_fffffffffffffb30->super_CapTableReader)._vptr_CapTableReader +
               (long)(in_stack_fffffffffffffb30->super_CapTableReader)._vptr_CapTableReader[-2]));
  }
  pRVar7 = local_450.hook.ptr;
  if (local_450.hook.ptr != (RequestHook *)0x0) {
    local_450.hook.ptr = (RequestHook *)0x0;
    (**(local_450.hook.disposer)->_vptr_Disposer)
              (local_450.hook.disposer,
               (_func_int *)((long)&pRVar7->_vptr_RequestHook + (long)pRVar7->_vptr_RequestHook[-2])
              );
  }
  pDVar11 = local_4a0.hook.disposer;
  uVar10 = local_4a0.super_Builder._builder._32_8_;
  if (local_4a0.super_Builder._builder._32_8_ != 0) {
    local_4a0.super_Builder._builder.dataSize = 0;
    local_4a0.super_Builder._builder.pointerCount = 0;
    local_4a0.super_Builder._builder._38_2_ = 0;
    local_4a0.hook.disposer = (Disposer *)0x0;
    (**(local_4a0.hook.ptr)->_vptr_RequestHook)(local_4a0.hook.ptr,uVar10,8,pDVar11,pDVar11,0);
  }
  pWVar6 = local_4a0.super_Builder._builder.pointers;
  if (local_4a0.super_Builder._builder.pointers != (WirePointer *)0x0) {
    local_4a0.super_Builder._builder.pointers = (WirePointer *)0x0;
    (*(code *)**local_4a0.super_Builder._builder.data)
              (local_4a0.super_Builder._builder.data,
               (long)&(pWVar6->offsetAndKind).value + *(long *)((long)*pWVar6 + -0x10));
  }
  pCVar5 = local_4a0.super_Builder._builder.capTable;
  if (local_4a0.super_Builder._builder.capTable != (CapTableBuilder *)0x0) {
    local_4a0.super_Builder._builder.capTable = (CapTableBuilder *)0x0;
    (*(code *)(((local_4a0.super_Builder._builder.segment)->super_SegmentReader).arena)->_vptr_Arena
    )(local_4a0.super_Builder._builder.segment,
      (_func_int *)
      ((long)&(pCVar5->super_CapTableReader)._vptr_CapTableReader +
      (long)(pCVar5->super_CapTableReader)._vptr_CapTableReader[-2]));
  }
  pRVar7 = local_3e0.hook.ptr;
  if (local_3e0.hook.ptr != (RequestHook *)0x0) {
    local_3e0.hook.ptr = (RequestHook *)0x0;
    (**(local_3e0.hook.disposer)->_vptr_Disposer)
              (local_3e0.hook.disposer,
               (_func_int *)((long)&pRVar7->_vptr_RequestHook + (long)pRVar7->_vptr_RequestHook[-2])
              );
  }
  plVar2 = plStack_570;
  if (plStack_570 != (long *)0x0) {
    plStack_570 = (long *)0x0;
    (*(code *)**(undefined8 **)CONCAT44(local_580._12_4_,local_580._8_4_))
              ((undefined8 *)CONCAT44(local_580._12_4_,local_580._8_4_),
               (long)plVar2 + *(long *)(*plVar2 + -0x10));
  }
  RpcSystemBase::~RpcSystemBase(&local_468);
  TwoPartyVatNetwork::~TwoPartyVatNetwork(&local_190);
  pAVar3 = local_528.pipe.ptr;
  if (local_528.pipe.ptr != (AsyncIoStream *)0x0) {
    local_528.pipe.ptr = (AsyncIoStream *)0x0;
    (**(local_528.pipe.disposer)->_vptr_Disposer)
              (local_528.pipe.disposer,
               (_func_int *)
               ((long)&(pAVar3->super_AsyncInputStream)._vptr_AsyncInputStream +
               (long)(pAVar3->super_AsyncInputStream)._vptr_AsyncInputStream[-2]));
  }
  if (local_528.thread.ptr != (Thread *)0x0) {
    local_528.thread.ptr = (Thread *)0x0;
    (**(local_528.thread.disposer)->_vptr_Disposer)();
  }
  pAVar4 = local_4f0;
  if (local_4f0 != (AsyncIoProvider *)0x0) {
    local_4f0 = (AsyncIoProvider *)0x0;
    (**(code **)*local_4f8)
              (local_4f8,
               (_func_int *)
               ((long)&pAVar4->_vptr_AsyncIoProvider + (long)pAVar4->_vptr_AsyncIoProvider[-2]));
  }
  plVar2 = local_500;
  if (local_500 != (long *)0x0) {
    local_500 = (long *)0x0;
    (**(code **)*local_508)(local_508,(long)plVar2 + *(long *)(*plVar2 + -0x10));
  }
  return;
}

Assistant:

TEST(TwoPartyNetwork, Basic) {
  auto ioContext = kj::setupAsyncIo();
  int callCount = 0;
  int handleCount = 0;

  auto serverThread = runServer(*ioContext.provider, callCount, handleCount);
  TwoPartyVatNetwork network(*serverThread.pipe, rpc::twoparty::Side::CLIENT);
  auto rpcClient = makeRpcClient(network);

  // Request the particular capability from the server.
  auto client = getPersistentCap(rpcClient, rpc::twoparty::Side::SERVER,
      test::TestSturdyRefObjectId::Tag::TEST_INTERFACE).castAs<test::TestInterface>();

  // Use the capability.
  auto request1 = client.fooRequest();
  request1.setI(123);
  request1.setJ(true);
  auto promise1 = request1.send();

  auto request2 = client.bazRequest();
  initTestMessage(request2.initS());
  auto promise2 = request2.send();

  bool barFailed = false;
  auto request3 = client.barRequest();
  auto promise3 = request3.send().then(
      [](Response<test::TestInterface::BarResults>&& response) {
        ADD_FAILURE() << "Expected bar() call to fail.";
      }, [&](kj::Exception&& e) {
        barFailed = true;
      });

  EXPECT_EQ(0, callCount);

  auto response1 = promise1.wait(ioContext.waitScope);

  EXPECT_EQ("foo", response1.getX());

  auto response2 = promise2.wait(ioContext.waitScope);

  promise3.wait(ioContext.waitScope);

  EXPECT_EQ(2, callCount);
  EXPECT_TRUE(barFailed);
}